

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibWriter.cpp
# Opt level: O0

bool __thiscall ZlibWriter::flush(ZlibWriter *this)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  ulong local_4038;
  size_t i;
  size_t bytes_written;
  uint8_t zchunk [16384];
  int zresult;
  ZlibWriter *this_local;
  
  if ((this->zbuf_changed & 1U) != 0) {
    (this->z).next_in = (Bytef *)0x0;
    (this->z).avail_in = 0;
    do {
      (this->z).next_out = (Bytef *)&bytes_written;
      (this->z).avail_out = 0x4000;
      iVar1 = deflate(&this->z,4);
      if ((iVar1 != 0) && (iVar1 != 1)) {
        return false;
      }
      uVar2 = (ulong)(0x4000 - (this->z).avail_out);
      if (uVar2 != 0) {
        sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->zbuf);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                  (&this->zbuf,sVar3 + uVar2);
        for (local_4038 = 0; local_4038 < uVar2; local_4038 = local_4038 + 1) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (&this->zbuf,zchunk + (local_4038 - 8));
        }
      }
    } while (iVar1 != 1);
    this->zbuf_changed = false;
  }
  return true;
}

Assistant:

bool ZlibWriter::flush() const
{
	if (!zbuf_changed)
	{
		return true;
	}

	int zresult;
	uint8_t zchunk[ZLIB_CHUNK_SIZE];

	z.next_in = Z_NULL;
	z.avail_in = 0;
	do
	{
		z.next_out = zchunk;
		z.avail_out = ZLIB_CHUNK_SIZE;

		zresult = deflate(&z, Z_FINISH);
		if (zresult != Z_OK && zresult != Z_STREAM_END)
		{
			return false;
		}

		size_t bytes_written = ZLIB_CHUNK_SIZE - z.avail_out;
		if (bytes_written != 0)
		{
			zbuf.reserve(zbuf.size() + bytes_written);
			for (size_t i = 0; i < bytes_written; i++)
			{
				zbuf.push_back(zchunk[i]);
			}
		}
	} while (zresult != Z_STREAM_END);

	zbuf_changed = false;
	return true;
}